

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::DynArrayDeleteMethod::~DynArrayDeleteMethod(DynArrayDeleteMethod *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit DynArrayDeleteMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Delete, SubroutineKind::Function, 0, {},
                               builtins.voidType, true,
                               /* isFirstArgLValue */ true) {}